

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O0

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  void *eval_b_7;
  void *eval_a_7;
  void *eval_b_6;
  void *eval_a_6;
  void *eval_b_5;
  void *eval_a_5;
  void *eval_b_4;
  void *eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  void *eval_b_2;
  void *eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  undefined1 auStack_38 [4];
  int r;
  uv_lib_t lib;
  char *msg;
  char *dlerror_no_error;
  char *path;
  
  lib.handle = (void *)0x0;
  _auStack_38 = (void *)0x0;
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_38);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x25,"msg","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x26,"strstr(msg, dlerror_no_error)","!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_dlopen("test/fixtures/load_error.node",(uv_lib_t *)auStack_38);
  if (iVar1 != -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x29,"r == -1");
    abort();
  }
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_38);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x2c,"msg","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"test/fixtures/load_error.node");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x2e,"strstr(msg, path)","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x30,"strstr(msg, dlerror_no_error)","==","NULL",pcVar2,"==",0);
    abort();
  }
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_38);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x34,"msg","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"test/fixtures/load_error.node");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x36,"strstr(msg, path)","!=","NULL",0,"!=",0);
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
            ,0x38,"strstr(msg, dlerror_no_error)","==","NULL",pcVar2,"==",0);
    abort();
  }
  uv_dlclose((uv_lib_t *)auStack_38);
  return 0;
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}